

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall
helics::Filter::setFilterOperations(Filter *this,shared_ptr<helics::FilterOperations> *filterOps)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<helics::FilterOperations> *in_RDI;
  shared_ptr<helics::FilterOperations> *in_stack_ffffffffffffffa8;
  bool local_2a;
  undefined1 local_28 [20];
  uint local_14;
  
  std::shared_ptr<helics::FilterOperations>::operator=(in_RDI,in_stack_ffffffffffffffa8);
  p_Var1 = (in_RDI->super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  local_14 = *(uint *)&in_RDI[1].
                       super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 4));
  if (bVar2) {
    peVar3 = std::
             __shared_ptr_access<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x31081d);
    (*peVar3->_vptr_FilterOperations[6])(local_28);
  }
  else {
    std::shared_ptr<helics::FilterOperator>::shared_ptr
              ((shared_ptr<helics::FilterOperator> *)in_RDI,in_stack_ffffffffffffffa8);
  }
  (*p_Var1->_vptr__Sp_counted_base[0x54])(p_Var1,(ulong)local_14,local_28);
  if (bVar2) {
    std::shared_ptr<helics::FilterOperator>::~shared_ptr
              ((shared_ptr<helics::FilterOperator> *)0x310887);
  }
  else {
    std::shared_ptr<helics::FilterOperator>::~shared_ptr
              ((shared_ptr<helics::FilterOperator> *)0x310874);
  }
  return;
}

Assistant:

void Filter::setFilterOperations(std::shared_ptr<FilterOperations> filterOps)
{
    filtOp = std::move(filterOps);
    mCore->setFilterOperator(handle, (filtOp) ? filtOp->getOperator() : nullptr);
}